

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void benchmark::internal::BenchmarkImp::AddRange
               (vector<int,_std::allocator<int>_> *dst,int lo,int hi,int mult)

{
  iterator iVar1;
  int local_44;
  int local_40;
  int local_3c;
  CheckHandler local_38;
  CheckHandler local_30;
  CheckHandler local_28;
  
  local_44 = lo;
  local_40 = hi;
  if (lo < 0) {
    CheckHandler::CheckHandler
              (&local_28,"(lo) >= (0)",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"AddRange",0x27d);
    CheckHandler::~CheckHandler(&local_28);
  }
  GetNullLogInstance();
  if (local_40 < local_44) {
    CheckHandler::CheckHandler
              (&local_30,"(hi) >= (lo)",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"AddRange",0x27e);
    CheckHandler::~CheckHandler(&local_30);
  }
  GetNullLogInstance();
  if (mult < 2) {
    CheckHandler::CheckHandler
              (&local_38,"(mult) >= (2)",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"AddRange",0x27f);
    CheckHandler::~CheckHandler(&local_38);
  }
  GetNullLogInstance();
  iVar1._M_current =
       (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)dst,iVar1,&local_44);
  }
  else {
    *iVar1._M_current = local_44;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  local_3c = 1;
  if (1 < local_40 && (uint)mult < 0x40000000) {
    do {
      if (local_44 < local_3c) {
        iVar1._M_current =
             (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)dst,iVar1,&local_3c);
        }
        else {
          *iVar1._M_current = local_3c;
          (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
      }
      local_3c = local_3c * mult;
    } while ((local_3c < (int)(0x7fffffff / (ulong)(uint)mult)) && (local_3c < local_40));
  }
  if (local_40 != local_44) {
    iVar1._M_current =
         (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar1._M_current ==
        (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)dst,iVar1,&local_40);
    }
    else {
      *iVar1._M_current = local_40;
      (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = iVar1._M_current + 1;
    }
  }
  return;
}

Assistant:

void BenchmarkImp::AddRange(std::vector<int>* dst, int lo, int hi, int mult) {
  CHECK_GE(lo, 0);
  CHECK_GE(hi, lo);
  CHECK_GE(mult, 2);

  // Add "lo"
  dst->push_back(lo);

  static const int kint32max = std::numeric_limits<int32_t>::max();

  // Now space out the benchmarks in multiples of "mult"
  for (int32_t i = 1; i < kint32max/mult; i *= mult) {
    if (i >= hi) break;
    if (i > lo) {
      dst->push_back(i);
    }
  }
  // Add "hi" (if different from "lo")
  if (hi != lo) {
    dst->push_back(hi);
  }
}